

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.cpp
# Opt level: O0

void __thiscall Trace::TraceToLog(Trace *this,char *inFormat,__va_list_tag *inList)

{
  Log *pLVar1;
  allocator<char> local_51;
  string local_50;
  __va_list_tag *local_20;
  __va_list_tag *inList_local;
  char *inFormat_local;
  Trace *this_local;
  
  if ((this->mShouldLog & 1U) != 0) {
    local_20 = inList;
    inList_local = (__va_list_tag *)inFormat;
    inFormat_local = this->mBuffer;
    if (this->mLog == (Log *)0x0) {
      if (this->mLogStream == (IByteWriter *)0x0) {
        pLVar1 = (Log *)operator_new(0x60);
        Log::Log(pLVar1,&this->mLogFilePath,(bool)(this->mPlaceUTF8Bom & 1));
        this->mLog = pLVar1;
      }
      else {
        pLVar1 = (Log *)operator_new(0x60);
        Log::Log(pLVar1,this->mLogStream);
        this->mLog = pLVar1;
      }
    }
    vsprintf(this->mBuffer,(char *)inList_local,local_20);
    pLVar1 = this->mLog;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,this->mBuffer,&local_51);
    Log::LogEntry(pLVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return;
}

Assistant:

void Trace::TraceToLog(const char* inFormat,va_list inList)
{
	if(mShouldLog)
	{
		if(NULL == mLog)
		{
			if(mLogStream)
				mLog = new Log(mLogStream);
			else
				mLog = new Log(mLogFilePath,mPlaceUTF8Bom);
		}

		SAFE_VSPRINTF(mBuffer, MAX_TRACE_SIZE,inFormat,inList);

		mLog->LogEntry(std::string(mBuffer));
	}

}